

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkpar.c
# Opt level: O0

void make_parser(void)

{
  action *paVar1;
  int local_c;
  int i;
  
  parser = (action **)allocate(nstates << 3);
  for (local_c = 0; local_c < nstates; local_c = local_c + 1) {
    paVar1 = parse_actions(local_c);
    parser[local_c] = paVar1;
  }
  find_final_state();
  remove_conflicts();
  unused_rules();
  if (0 < SRtotal + RRtotal) {
    total_conflicts();
  }
  defreds();
  return;
}

Assistant:

void make_parser()
{
    register int i;

    parser = NEW2(nstates, action *);
    for (i = 0; i < nstates; i++)
	parser[i] = parse_actions(i);

    find_final_state();
    remove_conflicts();
    unused_rules();
    if (SRtotal + RRtotal > 0) total_conflicts();
    defreds();
}